

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_Varint_Test::~UnknownFieldSetTest_Varint_Test
          (UnknownFieldSetTest_Varint_Test *this)

{
  UnknownFieldSetTest_Varint_Test *this_local;
  
  UnknownFieldSetTest::~UnknownFieldSetTest(&this->super_UnknownFieldSetTest);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, Varint) {
  const UnknownField* field = GetField("optional_int32");
  ASSERT_TRUE(field != nullptr);

  ASSERT_EQ(UnknownField::TYPE_VARINT, field->type());
  EXPECT_EQ(all_fields_.optional_int32(), field->varint());
}